

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TagTest.cpp
# Opt level: O1

void __thiscall
jaegertracing::Tag_testThriftConversion_Test::~Tag_testThriftConversion_Test
          (Tag_testThriftConversion_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Tag, testThriftConversion)
{
    const Tag tags[] = { { "testBool", true },
                         { "testDouble", 0.0 },
                         { "testInt64", 0LL },
                         { "testUint64", 0ULL },
                         { "testStr", std::string{ "test" } },
                         { "testNull", nullptr },
                         { "testCStr", "test" } };

    for (auto&& tag : tags) {
        thrift::Tag thriftTag;
        ASSERT_NO_THROW(tag.thrift(thriftTag));
    }
}